

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

RegSlot __thiscall IRBuilder::GetEnvRegForInnerFrameDisplay(IRBuilder *this)

{
  RegSlot RVar1;
  JITTimeFunctionBody *pJVar2;
  
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  RVar1 = JITTimeFunctionBody::GetLocalFrameDisplayReg(pJVar2);
  if (RVar1 != 0xffffffff) {
    return RVar1;
  }
  pJVar2 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  RVar1 = JITTimeFunctionBody::GetEnvReg(pJVar2);
  return RVar1;
}

Assistant:

Js::RegSlot
IRBuilder::GetEnvRegForInnerFrameDisplay() const
{
    Js::RegSlot envReg = m_func->GetJITFunctionBody()->GetLocalFrameDisplayReg();
    if (envReg == Js::Constants::NoRegister)
    {
        envReg = this->GetEnvReg();
    }

    return envReg;
}